

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

void Abc_SclReadSurfaceGenlib(SC_Surface *p)

{
  Vec_Flt_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  int iVar2;
  
  Vec_FltPush(&p->vIndex0,0.0);
  Vec_IntPush(&p->vIndex0I,0);
  Vec_FltPush(&p->vIndex1,0.0);
  Vec_IntPush(&p->vIndex1I,0);
  for (iVar1 = 0; iVar1 < (p->vIndex0).nSize; iVar1 = iVar1 + 1) {
    p_00 = Vec_FltAlloc((p->vIndex1).nSize);
    Vec_PtrPush(&p->vData,p_00);
    p_01 = Vec_IntAlloc((p->vIndex1).nSize);
    Vec_PtrPush(&p->vDataI,p_01);
    for (iVar2 = 0; iVar2 < (p->vIndex1).nSize; iVar2 = iVar2 + 1) {
      Vec_FltPush(p_00,1.0);
      Vec_IntPush(p_01,1000);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Reading library from file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Abc_SclReadSurfaceGenlib( SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    Vec_FltPush( &p->vIndex0, 0 );
    Vec_IntPush( &p->vIndex0I, Scl_Flt2Int(0) );

    Vec_FltPush( &p->vIndex1, 0 );
    Vec_IntPush( &p->vIndex1I, Scl_Flt2Int(0) );

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            Vec_FltPush( vVec, 1 );
            Vec_IntPush( vVecI, Scl_Flt2Int(1) );
        }
    }
}